

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::RunningTest::addSection(RunningTest *this,string *name)

{
  bool bVar1;
  iterator iVar2;
  SectionInfo *pSVar3;
  
  if (this->m_runStatus == NothingRun) {
    this->m_runStatus = EncounteredASection;
  }
  pSVar3 = this->m_currentSection;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
          ::find(&(pSVar3->m_subSections)._M_t,name);
  if (((_Rb_tree_header *)iVar2._M_node ==
       &(pSVar3->m_subSections)._M_t._M_impl.super__Rb_tree_header) ||
     (pSVar3 = *(SectionInfo **)(iVar2._M_node + 2), pSVar3 == (SectionInfo *)0x0)) {
    pSVar3 = SectionInfo::addSubSection(this->m_currentSection,name);
    this->m_changed = true;
  }
  if (((this->m_runStatus & ~EncounteredASection) == RanAtLeastOneSection) ||
     (2 < (int)pSVar3->m_status)) {
    bVar1 = false;
  }
  else {
    this->m_currentSection = pSVar3;
    this->m_lastSectionToRun = (SectionInfo *)0x0;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool addSection( const std::string& name ) {
            if( m_runStatus == NothingRun )
                m_runStatus = EncounteredASection;

            SectionInfo* thisSection = m_currentSection->findSubSection( name );
            if( !thisSection ) {
                thisSection = m_currentSection->addSubSection( name );
                m_changed = true;
            }

            if( !wasSectionSeen() && thisSection->shouldRun() ) {
                m_currentSection = thisSection;
                m_lastSectionToRun = NULL;
                return true;
            }
            return false;
        }